

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall Assimp::STEP::DB::SetInverseIndicesToTrack(DB *this,char **types,size_t N)

{
  ConversionSchema *this_00;
  char *pcVar1;
  size_t sVar2;
  char *sz;
  allocator<char> local_61;
  char **local_60;
  char *local_58;
  string local_50;
  
  sVar2 = 0;
  local_60 = types;
  while( true ) {
    if (N == sVar2) {
      return;
    }
    this_00 = this->schema;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,local_60[sVar2],&local_61);
    pcVar1 = EXPRESS::ConversionSchema::GetStaticStringForToken(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = pcVar1;
    if (pcVar1 == (char *)0x0) break;
    std::
    _Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
    ::_M_insert_unique<char_const*const&>
              ((_Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
                *)&this->inv_whitelist,&local_58);
    sVar2 = sVar2 + 1;
  }
  __assert_fail("sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/./code/Step/STEPFile.h"
                ,0x3db,
                "void Assimp::STEP::DB::SetInverseIndicesToTrack(const char *const *, size_t)");
}

Assistant:

void SetInverseIndicesToTrack( const char* const* types, size_t N ) {
            for(size_t i = 0; i < N;++i) {
                const char* const sz = schema->GetStaticStringForToken(types[i]);
                ai_assert(sz);
                inv_whitelist.insert(sz);
            }
        }